

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_chunked_sequence.cpp
# Opt level: O3

void __thiscall
ChunkedSequenceChunkIterators_TwoChunks_Test::TestBody
          (ChunkedSequenceChunkIterators_TwoChunks_Test *this)

{
  _List_node_base *p_Var1;
  pointer *__ptr;
  char *pcVar2;
  chunked_sequence<int,_2UL,_4UL,_4UL> cs;
  _List_iterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk> local_58;
  int local_50 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  AssertHelper local_40;
  _List_iterator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk> local_38;
  chunked_sequence<int,_2UL,_4UL,_4UL> local_30;
  
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunked_sequence(&local_30);
  local_50[0] = 0x2f;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>(&local_30,local_50);
  local_50[0] = 0x35;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>(&local_30,local_50);
  local_50[0] = 0x3b;
  pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::emplace_back<int>(&local_30,local_50);
  local_38._M_node =
       (_List_node_base *)
       local_30.chunks_.
       super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
       ._M_impl._M_node._M_size;
  local_58._M_node._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_50,"cs.chunks_size ()","2U",(unsigned_long *)&local_38,
             (uint *)&local_58);
  if (local_50[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x19d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
    if (local_38._M_node != (_List_node_base *)0x0) {
      (*(code *)(local_38._M_node)->_M_next->_M_prev)();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_38._M_node =
       local_30.chunks_.
       super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_58._M_node =
       local_30.chunks_.
       super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
       ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
  local_40.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_50,"it->size ()","2U",(unsigned_long *)&local_58,(uint *)&local_40);
  if (local_50[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x19f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_58._M_node != (_List_node_base *)0x0) {
      (*(code *)(local_58._M_node)->_M_next->_M_prev)();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  p_Var1 = (local_30.chunks_.
            super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
            ._M_impl._M_node.super__List_node_base._M_next)->_M_next;
  local_58._M_node = p_Var1[1]._M_next;
  local_40.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_50,"it->size ()","1U",(unsigned_long *)&local_58,(uint *)&local_40);
  if (local_50[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x1a1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_58._M_node != (_List_node_base *)0x0) {
      (*(code *)(local_58._M_node)->_M_next->_M_prev)();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  local_38._M_node = p_Var1->_M_next;
  local_58._M_node = (_List_node_base *)&local_30;
  testing::internal::
  CmpHelperEQ<std::_List_iterator<pstore::chunked_sequence<int,2ul,4ul,4ul>::chunk>,std::_List_iterator<pstore::chunked_sequence<int,2ul,4ul,4ul>::chunk>>
            ((internal *)local_50,"it","cs.chunks_end ()",&local_38,&local_58);
  if (local_50[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_chunked_sequence.cpp"
               ,0x1a3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((chunked_sequence<int,_2UL,_4UL,_4UL> *)local_58._M_node !=
        (chunked_sequence<int,_2UL,_4UL,_4UL> *)0x0) {
      (*(code *)((((chunk_list *)&(local_58._M_node)->_M_next)->
                 super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
                 )._M_impl._M_node.super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  std::__cxx11::
  _List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
  ::_M_clear((_List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
              *)&local_30);
  return;
}

Assistant:

TEST (ChunkedSequenceChunkIterators, TwoChunks) {
    pstore::chunked_sequence<int, 2U> cs;

    cs.emplace_back (47);
    cs.emplace_back (53);
    cs.emplace_back (59);

    EXPECT_EQ (cs.chunks_size (), 2U);
    decltype (cs)::chunk_list::iterator it = cs.chunks_begin ();
    EXPECT_EQ (it->size (), 2U);
    std::advance (it, 1);
    EXPECT_EQ (it->size (), 1U);
    std::advance (it, 1);
    EXPECT_EQ (it, cs.chunks_end ());
}